

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-client.c
# Opt level: O3

SshChannel * ssh2_session_open(ConnectionLayer *cl,Channel *chan)

{
  LogContext *ctx;
  ssh2_channel *c;
  char *event;
  PktOut *pPVar1;
  
  c = (ssh2_channel *)safemalloc(1,0xc0,0);
  c->connlayer = (ssh2_connection_state *)&cl[-0xe].vt;
  ssh2_channel_init(c);
  c->halfopen = true;
  c->chan = chan;
  ctx = cl[5].logctx;
  event = dupprintf("Opening main session channel");
  logevent_and_free(ctx,event);
  pPVar1 = ssh2_chanopen_init(c,"session");
  pq_base_push((PacketQueueBase *)cl[2].vt,&pPVar1->qnode);
  return &c->sc;
}

Assistant:

SshChannel *ssh2_session_open(ConnectionLayer *cl, Channel *chan)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */
    struct ssh2_channel *c = snew(struct ssh2_channel);
    PktOut *pktout;

    c->connlayer = s;
    ssh2_channel_init(c);
    c->halfopen = true;
    c->chan = chan;

    ppl_logevent("Opening main session channel");

    pktout = ssh2_chanopen_init(c, "session");
    pq_push(s->ppl.out_pq, pktout);

    return &c->sc;
}